

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

LPWSTR Internal_i64tow(INT64 value,LPWSTR string,int radix,BOOL isI64)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  LPWSTR pWVar8;
  int iVar9;
  WCHAR WVar10;
  bool bVar11;
  
  if (radix - 0x25U < 0xffffffdd) {
    fprintf(_stderr,"] %s %s:%d","Internal_i64tow",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
            ,0x65);
    fprintf(_stderr,"Invalid radix, radix must be between 2 and 36\n");
    SetLastError(0x57);
  }
  else {
    uVar4 = value & 0xffffffff;
    if (isI64 != 0) {
      uVar4 = value;
    }
    uVar5 = -value;
    if (-1 < value || radix != 10) {
      uVar5 = uVar4;
    }
    if (uVar5 == 0) {
      pWVar8 = string + 1;
      *string = L'0';
      iVar6 = 1;
    }
    else {
      iVar6 = 0;
      pWVar8 = string;
      do {
        iVar6 = iVar6 + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = CONCAT44(0,radix);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar5;
        iVar9 = (int)uVar5 - SUB164(auVar2 / auVar1,0) * radix;
        sVar3 = (short)iVar9;
        WVar10 = sVar3 + L'W';
        if (iVar9 < 10) {
          WVar10 = sVar3 + L'0';
        }
        *pWVar8 = WVar10;
        pWVar8 = pWVar8 + 1;
        bVar11 = CONCAT44(0,radix) <= uVar5;
        uVar5 = SUB168(auVar2 / auVar1,0);
      } while (bVar11);
    }
    if (-1 >= value && radix == 10) {
      *pWVar8 = L'-';
      pWVar8 = pWVar8 + 1;
      iVar6 = iVar6 + 1;
    }
    *pWVar8 = L'\0';
    if (0 < (int)(iVar6 - 1U)) {
      lVar7 = 0;
      uVar4 = (ulong)(iVar6 - 1U);
      do {
        uVar5 = uVar4 - 1;
        WVar10 = string[lVar7];
        string[lVar7] = string[uVar4];
        string[uVar4] = WVar10;
        lVar7 = lVar7 + 1;
        uVar4 = uVar5;
      } while (lVar7 < (long)uVar5);
    }
  }
  return string;
}

Assistant:

LPWSTR Internal_i64tow(INT64 value, LPWSTR string, int radix, BOOL isI64)
{
    int length = 0;
    int n;
    int r;
    UINT64 uval = value;
    LPWSTR stringPtr = string;
    int start = 0;
    int end;
    WCHAR tempCh;

    if (radix < 2 || radix > 36)
    {
        ASSERT( "Invalid radix, radix must be between 2 and 36\n" );
        SetLastError(ERROR_INVALID_PARAMETER);
        return string;
    }
    if (FALSE == isI64)
    {
        uval = (ULONG) uval;
    }
    if (10 == radix && value < 0)
    {
        uval = value * -1;
    }
    if(0 == uval)
    {
        ++length;
        *stringPtr++ = '0';
    }
    else while (uval > 0)
    {
        ++length;
        n = uval / radix;
        r = uval - (n * radix);
        uval /= radix;
        if (r > 9)
        {
            *stringPtr++ = r + 87;
        }
        else
        {
            *stringPtr++ = r + 48;
        }
    }
    if (10 == radix && value < 0)
    {
        *stringPtr++ = '-';
        ++length;
    }
    *stringPtr = 0; /* end the string */

    /* reverse the string */
    end = length - 1;
    while (start < end)
    {
        tempCh = string[start];
        string[start] = string[end];
        string[end] = tempCh;
        ++start;
        --end;
    }

    return string;
}